

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test7::getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,
          _variable_type input_variable_type,uint array_size)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  _variable_type type;
  string local_528 [32];
  string local_508 [32];
  string local_4e8;
  stringstream local_4c8 [8];
  stringstream array_size_stringstream;
  ostream local_4b8;
  stringstream local_330 [8];
  stringstream array_index_stringstream;
  ostream local_320;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  uint local_20;
  _variable_type local_1c;
  uint array_size_local;
  _variable_type input_variable_type_local;
  GPUShaderFP64Test7 *this_local;
  
  local_20 = array_size;
  local_1c = input_variable_type;
  _array_size_local = this;
  this_local = (GPUShaderFP64Test7 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::stringstream(local_330);
  std::__cxx11::stringstream::stringstream(local_4c8);
  if (1 < local_20) {
    std::operator<<(&local_320,"[0]");
    poVar3 = std::operator<<(&local_4b8,"[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    std::operator<<(poVar3,"]");
  }
  bVar1 = Utils::isMatrixVariableType(local_1c);
  if (bVar1) {
    std::operator<<(&local_320,"[0].x");
  }
  else {
    uVar2 = Utils::getNumberOfComponentsForVariableType(local_1c);
    if (1 < uVar2) {
      std::operator<<(&local_320,"[0]");
    }
  }
  poVar3 = std::operator<<(&local_198,"#version 400\n\nin ");
  Utils::getVariableTypeString_abi_cxx11_(&local_4e8,(Utils *)(ulong)local_1c,type);
  poVar3 = std::operator<<(poVar3,(string *)&local_4e8);
  poVar3 = std::operator<<(poVar3," test_input");
  std::__cxx11::stringstream::str();
  poVar3 = std::operator<<(poVar3,local_508);
  poVar3 = std::operator<<(poVar3,
                           ";\n\nout float test_output;\n\nvoid main()\n{\n    if (test_input");
  std::__cxx11::stringstream::str();
  poVar3 = std::operator<<(poVar3,local_528);
  std::operator<<(poVar3,
                  " > 2.0)\n    {\n        test_output = 1.0;\n    }\n    else\n    {\n        test_output = 3.0;\n    }\n}\n"
                 );
  std::__cxx11::string::~string(local_528);
  std::__cxx11::string::~string(local_508);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::__cxx11::stringstream::~stringstream(local_330);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput(
	Utils::_variable_type input_variable_type, unsigned int array_size)
{
	std::stringstream result_sstream;
	std::stringstream array_index_stringstream;
	std::stringstream array_size_stringstream;

	if (array_size > 1)
	{
		array_index_stringstream << "[0]";
		array_size_stringstream << "[" << array_size << "]";
	}

	if (Utils::isMatrixVariableType(input_variable_type))
	{
		array_index_stringstream << "[0].x";
	}
	else if (Utils::getNumberOfComponentsForVariableType(input_variable_type) > 1)
	{
		array_index_stringstream << "[0]";
	}

	result_sstream << "#version 400\n"
					  "\n"
					  "in "
				   << Utils::getVariableTypeString(input_variable_type) << " test_input"
				   << array_size_stringstream.str() << ";\n"
													   "\n"
													   "out float test_output;\n"
													   "\n"
													   "void main()\n"
													   "{\n"
													   "    if (test_input"
				   << array_index_stringstream.str() << " > 2.0)\n"
														"    {\n"
														"        test_output = 1.0;\n"
														"    }\n"
														"    else\n"
														"    {\n"
														"        test_output = 3.0;\n"
														"    }\n"
														"}\n";

	return result_sstream.str();
}